

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::DuplicateNameDetector::check
          (DuplicateNameDetector *this,Reader nestedDecls,Which parentKind)

{
  int *__return_storage_ptr__;
  size_t *psVar1;
  ErrorReporter *pEVar2;
  Reader nestedDecls_00;
  Reader nestedDecls_01;
  Reader exp;
  bool bVar3;
  char cVar4;
  Which WVar5;
  size_t sVar6;
  pointer ppVar7;
  uint uVar8;
  char (*params) [51];
  char (*params_00) [25];
  char (*in_R8) [36];
  Iterator IVar9;
  __enable_if_t<is_constructible<value_type,_pair<Reader,_Reader>_>::value,_pair<iterator,_bool>_>
  _Var10;
  ErrorReporter *in_stack_fffffffffffffac8;
  ArrayPtr<const_char> local_430;
  Reader local_420;
  DuplicateNameDetector local_3f0;
  Reader local_3b8;
  Reader local_388;
  ArrayPtr<const_char> local_358;
  ArrayPtr<const_char> local_348;
  ArrayPtr<const_char> local_338;
  ArrayPtr<const_char> local_328;
  ArrayPtr<const_char> local_318;
  ArrayPtr<const_char> local_308;
  StringPtr local_2f0;
  uint local_2dc;
  Fault local_2d8;
  Fault f;
  size_t local_2c8;
  DebugExpression<unsigned_long> local_2c0;
  undefined1 local_2b8 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  ArrayPtr<const_char> local_280;
  ArrayPtr<const_char> local_270;
  ArrayPtr<const_char> local_260;
  Reader local_250;
  Reader local_220;
  undefined1 local_1f0 [8];
  StringPtr targetName;
  ArrayPtr<const_char> local_1c8;
  String local_1b8;
  ArrayPtr<const_char> local_1a0;
  String local_190;
  ArrayPtr<const_char> local_178 [2];
  String local_158;
  ArrayPtr<const_char> local_140;
  _Base_ptr local_130;
  undefined1 local_128;
  pair<capnp::Text::Reader,_capnp::compiler::LocatedText::Reader> local_120;
  _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_> local_e0;
  __enable_if_t<is_constructible<value_type,_pair<Reader,_Reader>_>::value,_pair<iterator,_bool>_>
  insertResult;
  Reader nameText;
  Reader name;
  Reader decl;
  undefined1 local_50 [8];
  Iterator __end2;
  undefined1 local_30 [8];
  Iterator __begin2;
  Reader *__range2;
  Which parentKind_local;
  DuplicateNameDetector *this_local;
  
  __begin2._8_8_ = &nestedDecls;
  IVar9 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::begin
                    ((Reader *)__begin2._8_8_);
  __end2._8_8_ = IVar9.container;
  __begin2.container._0_4_ = IVar9.index;
  local_30 = (undefined1  [8])__end2._8_8_;
  IVar9 = List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader::end((Reader *)__begin2._8_8_);
  local_50 = (undefined1  [8])IVar9.container;
  __end2.container._0_4_ = IVar9.index;
  do {
    bVar3 = capnp::_::
            IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
            ::operator==((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                          *)local_30,
                         (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                          *)local_50);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      return;
    }
    __return_storage_ptr__ = &name._reader.nestingLimit;
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator*((Reader *)__return_storage_ptr__,
                (IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                 *)local_30);
    psVar1 = &nameText.super_StringPtr.content.size_;
    Declaration::Reader::getName((Reader *)psVar1,(Reader *)__return_storage_ptr__);
    join_0x00000010_0x00000000_ =
         (ArrayPtr<const_char>)LocatedText::Reader::getValue((Reader *)psVar1);
    std::make_pair<capnp::Text::Reader&,capnp::compiler::LocatedText::Reader&>
              (&local_120,(Reader *)&insertResult.second,(Reader *)psVar1);
    _Var10 = std::
             map<kj::StringPtr,capnp::compiler::LocatedText::Reader,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
             ::insert<std::pair<capnp::Text::Reader,capnp::compiler::LocatedText::Reader>>
                       ((map<kj::StringPtr,capnp::compiler::LocatedText::Reader,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,capnp::compiler::LocatedText::Reader>>>
                         *)&this->names,&local_120);
    local_130 = (_Base_ptr)_Var10.first._M_node;
    local_128 = _Var10.second;
    local_e0._M_node = local_130;
    insertResult.first._M_node._0_1_ = local_128;
    if (((undefined1  [16])_Var10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      sVar6 = kj::StringPtr::size((StringPtr *)&insertResult.second);
      if ((sVar6 == 0) &&
         (bVar3 = Declaration::Reader::isUnion((Reader *)&name._reader.nestingLimit), bVar3)) {
        pEVar2 = this->errorReporter;
        kj::str<char_const(&)[51]>
                  (&local_158,(kj *)"An unnamed union is already defined in this scope.",params);
        kj::StringPtr::StringPtr((StringPtr *)&local_140,&local_158);
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar2,(Reader *)&nameText.super_StringPtr.content.size_,(StringPtr)local_140);
        kj::String::~String(&local_158);
        pEVar2 = this->errorReporter;
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>
                 ::operator->(&local_e0);
        kj::str<char_const(&)[25]>(&local_190,(kj *)"Previously defined here.",params_00);
        kj::StringPtr::StringPtr((StringPtr *)local_178,&local_190);
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar2,&ppVar7->second,(StringPtr)local_178[0]);
        kj::String::~String(&local_190);
      }
      else {
        pEVar2 = this->errorReporter;
        kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[36]>
                  (&local_1b8,(kj *)0xa61187,(char (*) [2])&insertResult.second,
                   (Reader *)"\' is already defined in this scope.",in_R8);
        kj::StringPtr::StringPtr((StringPtr *)&local_1a0,&local_1b8);
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar2,(Reader *)&nameText.super_StringPtr.content.size_,(StringPtr)local_1a0);
        kj::String::~String(&local_1b8);
        pEVar2 = this->errorReporter;
        ppVar7 = std::
                 _Rb_tree_iterator<std::pair<const_kj::StringPtr,_capnp::compiler::LocatedText::Reader>_>
                 ::operator->(&local_e0);
        psVar1 = &targetName.content.size_;
        kj::str<char_const(&)[2],capnp::Text::Reader&,char_const(&)[27]>
                  ((String *)psVar1,(kj *)0xa61187,(char (*) [2])&insertResult.second,
                   (Reader *)"\' previously defined here.",(char (*) [27])in_R8);
        kj::StringPtr::StringPtr((StringPtr *)&local_1c8,(String *)psVar1);
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar2,&ppVar7->second,(StringPtr)local_1c8);
        kj::String::~String((String *)&targetName.content.size_);
      }
    }
    WVar5 = Declaration::Reader::which((Reader *)&name._reader.nestingLimit);
    uVar8 = (uint)WVar5;
    if (WVar5 == USING) {
      Declaration::Reader::getUsing(&local_250,(Reader *)&name._reader.nestingLimit);
      Declaration::Using::Reader::getTarget(&local_220,&local_250);
      exp._reader.capTable = (CapTableReader *)local_220._reader.data;
      exp._reader.segment = (SegmentReader *)local_220._reader.capTable;
      exp._reader.data = local_220._reader.pointers;
      exp._reader.pointers = (WirePointer *)local_220._reader._32_8_;
      exp._reader.dataSize = local_220._reader.nestingLimit;
      exp._reader.pointerCount = local_220._reader._44_2_;
      exp._reader._38_2_ = local_220._reader._46_2_;
      exp._reader._40_8_ = in_stack_fffffffffffffac8;
      _local_1f0 = (ArrayPtr<const_char>)getExpressionTargetName(exp);
      sVar6 = kj::StringPtr::size((StringPtr *)local_1f0);
      if (((sVar6 == 0) ||
          (cVar4 = kj::StringPtr::operator[]((StringPtr *)local_1f0,0), cVar4 < 'a')) ||
         (cVar4 = kj::StringPtr::operator[]((StringPtr *)local_1f0,0), 'z' < cVar4)) {
        sVar6 = kj::StringPtr::size((StringPtr *)&insertResult.second);
        if ((sVar6 != 0) &&
           ((cVar4 = kj::StringPtr::operator[]((StringPtr *)&insertResult.second,0), cVar4 < 'A' ||
            (cVar4 = kj::StringPtr::operator[]((StringPtr *)&insertResult.second,0), 'Z' < cVar4))))
        {
          pEVar2 = this->errorReporter;
          kj::StringPtr::StringPtr
                    ((StringPtr *)&local_270,"Type names must begin with a capital letter.");
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                    (pEVar2,(Reader *)&nameText.super_StringPtr.content.size_,(StringPtr)local_270);
        }
      }
      else {
        sVar6 = kj::StringPtr::size((StringPtr *)&insertResult.second);
        if ((sVar6 != 0) &&
           ((cVar4 = kj::StringPtr::operator[]((StringPtr *)&insertResult.second,0), cVar4 < 'a' ||
            (cVar4 = kj::StringPtr::operator[]((StringPtr *)&insertResult.second,0), 'z' < cVar4))))
        {
          pEVar2 = this->errorReporter;
          kj::StringPtr::StringPtr
                    ((StringPtr *)&local_260,"Non-type names must begin with a lower-case letter.");
          ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                    (pEVar2,(Reader *)&nameText.super_StringPtr.content.size_,(StringPtr)local_260);
        }
      }
    }
    else {
      if (uVar8 != 2) {
        if (uVar8 == 3) {
LAB_006adcc3:
          sVar6 = kj::StringPtr::size((StringPtr *)&insertResult.second);
          if ((sVar6 != 0) &&
             ((cVar4 = kj::StringPtr::operator[]((StringPtr *)&insertResult.second,0), cVar4 < 'A'
              || (cVar4 = kj::StringPtr::operator[]((StringPtr *)&insertResult.second,0),
                 'Z' < cVar4)))) {
            pEVar2 = this->errorReporter;
            kj::StringPtr::StringPtr
                      ((StringPtr *)&local_280,"Type names must begin with a capital letter.");
            ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                      (pEVar2,(Reader *)&nameText.super_StringPtr.content.size_,(StringPtr)local_280
                      );
          }
          goto LAB_006adeda;
        }
        if (uVar8 != 4) {
          if (uVar8 == 5) goto LAB_006adcc3;
          if (2 < uVar8 - 6) {
            if (uVar8 == 9) goto LAB_006adcc3;
            if (1 < uVar8 - 10) {
              local_2c8 = kj::StringPtr::size((StringPtr *)&insertResult.second);
              local_2c0 = kj::_::DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_2c8);
              f.exception._4_4_ = 0;
              kj::_::DebugExpression<unsigned_long>::operator==
                        ((DebugComparison<unsigned_long,_int> *)local_2b8,&local_2c0,
                         (int *)((long)&f.exception + 4));
              bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_2b8);
              if (!bVar3) {
                WVar5 = Declaration::Reader::which((Reader *)&name._reader.nestingLimit);
                local_2dc = (uint)WVar5;
                kj::_::Debug::Fault::
                Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[55],unsigned_int>
                          (&local_2d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                           ,0x314,FAILED,"nameText.size() == 0",
                           "_kjCondition,\"Don\'t know what naming rules to enforce for node type.\", (uint)decl.which()"
                           ,(DebugComparison<unsigned_long,_int> *)local_2b8,
                           (char (*) [55])"Don\'t know what naming rules to enforce for node type.",
                           &local_2dc);
                kj::_::Debug::Fault::fatal(&local_2d8);
              }
              goto LAB_006adeda;
            }
          }
        }
      }
      sVar6 = kj::StringPtr::size((StringPtr *)&insertResult.second);
      if ((sVar6 != 0) &&
         ((cVar4 = kj::StringPtr::operator[]((StringPtr *)&insertResult.second,0), cVar4 < 'a' ||
          (cVar4 = kj::StringPtr::operator[]((StringPtr *)&insertResult.second,0), 'z' < cVar4)))) {
        pEVar2 = this->errorReporter;
        kj::StringPtr::StringPtr
                  ((StringPtr *)&_kjCondition.result,
                   "Non-type names must begin with a lower-case letter.");
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                  (pEVar2,(Reader *)&nameText.super_StringPtr.content.size_,
                   (StringPtr)stack0xfffffffffffffd70);
      }
    }
LAB_006adeda:
    kj::StringPtr::findFirst(&local_2f0,(char)&insertResult + '\b');
    bVar3 = kj::Maybe<unsigned_long>::operator==((Maybe<unsigned_long> *)&local_2f0);
    kj::Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_2f0);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      pEVar2 = this->errorReporter;
      kj::StringPtr::StringPtr
                ((StringPtr *)&local_308,
                 "Cap\'n Proto declaration names should use camelCase and must not contain underscores. (Code generators may convert names to the appropriate style for the target language.)"
                );
      ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>
                (pEVar2,(Reader *)&nameText.super_StringPtr.content.size_,(StringPtr)local_308);
    }
    WVar5 = Declaration::Reader::which((Reader *)&name._reader.nestingLimit);
    switch(WVar5) {
    case USING:
    case CONST:
    case ENUM:
    case STRUCT:
    case INTERFACE:
    case ANNOTATION:
      if (((parentKind != FILE) && (parentKind != STRUCT)) && (parentKind != INTERFACE)) {
        pEVar2 = this->errorReporter;
        kj::StringPtr::StringPtr
                  ((StringPtr *)&local_318,"This kind of declaration doesn\'t belong here.");
        ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>
                  (pEVar2,(Reader *)&name._reader.nestingLimit,(StringPtr)local_318);
      }
      break;
    case ENUMERANT:
      if (parentKind != ENUM) {
        pEVar2 = this->errorReporter;
        kj::StringPtr::StringPtr((StringPtr *)&local_328,"Enumerants can only appear in enums.");
        ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>
                  (pEVar2,(Reader *)&name._reader.nestingLimit,(StringPtr)local_328);
      }
      break;
    case FIELD:
    case UNION:
    case GROUP:
      if ((parentKind != STRUCT) && (parentKind != UNION && parentKind != GROUP)) {
        pEVar2 = this->errorReporter;
        kj::StringPtr::StringPtr
                  ((StringPtr *)&local_348,"This declaration can only appear in structs.");
        ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>
                  (pEVar2,(Reader *)&name._reader.nestingLimit,(StringPtr)local_348);
      }
      Declaration::Reader::getName(&local_388,(Reader *)&name._reader.nestingLimit);
      local_358 = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&local_388);
      sVar6 = kj::StringPtr::size((StringPtr *)&local_358);
      if (sVar6 == 0) {
        Declaration::Reader::getNestedDecls(&local_3b8,(Reader *)&name._reader.nestingLimit);
        WVar5 = Declaration::Reader::which((Reader *)&name._reader.nestingLimit);
        nestedDecls_00.reader.capTable = local_3b8.reader.capTable;
        nestedDecls_00.reader.segment = local_3b8.reader.segment;
        nestedDecls_00.reader.ptr = local_3b8.reader.ptr;
        nestedDecls_00.reader.elementCount = local_3b8.reader.elementCount;
        nestedDecls_00.reader.step = local_3b8.reader.step;
        nestedDecls_00.reader.structDataSize = local_3b8.reader.structDataSize;
        nestedDecls_00.reader.structPointerCount = local_3b8.reader.structPointerCount;
        nestedDecls_00.reader.elementSize = local_3b8.reader.elementSize;
        nestedDecls_00.reader._39_1_ = local_3b8.reader._39_1_;
        nestedDecls_00.reader.nestingLimit = local_3b8.reader.nestingLimit;
        nestedDecls_00.reader._44_4_ = local_3b8.reader._44_4_;
        check(this,nestedDecls_00,WVar5);
      }
      else {
        DuplicateNameDetector(&local_3f0,this->errorReporter);
        Declaration::Reader::getNestedDecls(&local_420,(Reader *)&name._reader.nestingLimit);
        WVar5 = Declaration::Reader::which((Reader *)&name._reader.nestingLimit);
        nestedDecls_01.reader.capTable = local_420.reader.capTable;
        nestedDecls_01.reader.segment = local_420.reader.segment;
        nestedDecls_01.reader.ptr = local_420.reader.ptr;
        nestedDecls_01.reader.elementCount = local_420.reader.elementCount;
        nestedDecls_01.reader.step = local_420.reader.step;
        nestedDecls_01.reader.structDataSize = local_420.reader.structDataSize;
        nestedDecls_01.reader.structPointerCount = local_420.reader.structPointerCount;
        nestedDecls_01.reader.elementSize = local_420.reader.elementSize;
        nestedDecls_01.reader._39_1_ = local_420.reader._39_1_;
        nestedDecls_01.reader.nestingLimit = local_420.reader.nestingLimit;
        nestedDecls_01.reader._44_4_ = local_420.reader._44_4_;
        check(&local_3f0,nestedDecls_01,WVar5);
        ~DuplicateNameDetector(&local_3f0);
      }
      break;
    case METHOD:
      if (parentKind != INTERFACE) {
        pEVar2 = this->errorReporter;
        kj::StringPtr::StringPtr((StringPtr *)&local_338,"Methods can only appear in interfaces.");
        ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>
                  (pEVar2,(Reader *)&name._reader.nestingLimit,(StringPtr)local_338);
      }
      break;
    default:
      in_stack_fffffffffffffac8 = this->errorReporter;
      kj::StringPtr::StringPtr
                ((StringPtr *)&local_430,"This kind of declaration doesn\'t belong here.");
      ErrorReporter::addErrorOn<capnp::compiler::Declaration::Reader&>
                (in_stack_fffffffffffffac8,(Reader *)&name._reader.nestingLimit,(StringPtr)local_430
                );
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
    ::operator++((IndexingIterator<const_capnp::List<capnp::compiler::Declaration,_(capnp::Kind)3>::Reader,_capnp::compiler::Declaration::Reader>
                  *)local_30);
  } while( true );
}

Assistant:

void NodeTranslator::DuplicateNameDetector::check(
    List<Declaration>::Reader nestedDecls, Declaration::Which parentKind) {
  for (auto decl: nestedDecls) {
    {
      auto name = decl.getName();
      auto nameText = name.getValue();
      auto insertResult = names.insert(std::make_pair(nameText, name));
      if (!insertResult.second) {
        if (nameText.size() == 0 && decl.isUnion()) {
          errorReporter.addErrorOn(
              name, kj::str("An unnamed union is already defined in this scope."));
          errorReporter.addErrorOn(
              insertResult.first->second, kj::str("Previously defined here."));
        } else {
          errorReporter.addErrorOn(
              name, kj::str("'", nameText, "' is already defined in this scope."));
          errorReporter.addErrorOn(
              insertResult.first->second, kj::str("'", nameText, "' previously defined here."));
        }
      }

      switch (decl.which()) {
        case Declaration::USING: {
          kj::StringPtr targetName = getExpressionTargetName(decl.getUsing().getTarget());
          if (targetName.size() > 0 && targetName[0] >= 'a' && targetName[0] <= 'z') {
            // Target starts with lower-case letter, so alias should too.
            if (nameText.size() > 0 && (nameText[0] < 'a' || nameText[0] > 'z')) {
              errorReporter.addErrorOn(name,
                  "Non-type names must begin with a lower-case letter.");
            }
          } else {
            // Target starts with capital or is not named (probably, an import). Require
            // capitalization.
            if (nameText.size() > 0 && (nameText[0] < 'A' || nameText[0] > 'Z')) {
              errorReporter.addErrorOn(name,
                  "Type names must begin with a capital letter.");
            }
          }
          break;
        }

        case Declaration::ENUM:
        case Declaration::STRUCT:
        case Declaration::INTERFACE:
          if (nameText.size() > 0 && (nameText[0] < 'A' || nameText[0] > 'Z')) {
            errorReporter.addErrorOn(name,
                "Type names must begin with a capital letter.");
          }
          break;

        case Declaration::CONST:
        case Declaration::ANNOTATION:
        case Declaration::ENUMERANT:
        case Declaration::METHOD:
        case Declaration::FIELD:
        case Declaration::UNION:
        case Declaration::GROUP:
          if (nameText.size() > 0 && (nameText[0] < 'a' || nameText[0] > 'z')) {
            errorReporter.addErrorOn(name,
                "Non-type names must begin with a lower-case letter.");
          }
          break;

        default:
          KJ_ASSERT(nameText.size() == 0, "Don't know what naming rules to enforce for node type.",
                    (uint)decl.which());
          break;
      }

      if (nameText.findFirst('_') != kj::none) {
        errorReporter.addErrorOn(name,
            "Cap'n Proto declaration names should use camelCase and must not contain "
            "underscores. (Code generators may convert names to the appropriate style for the "
            "target language.)");
      }
    }

    switch (decl.which()) {
      case Declaration::USING:
      case Declaration::CONST:
      case Declaration::ENUM:
      case Declaration::STRUCT:
      case Declaration::INTERFACE:
      case Declaration::ANNOTATION:
        switch (parentKind) {
          case Declaration::FILE:
          case Declaration::STRUCT:
          case Declaration::INTERFACE:
            // OK.
            break;
          default:
            errorReporter.addErrorOn(decl, "This kind of declaration doesn't belong here.");
            break;
        }
        break;

      case Declaration::ENUMERANT:
        if (parentKind != Declaration::ENUM) {
          errorReporter.addErrorOn(decl, "Enumerants can only appear in enums.");
        }
        break;
      case Declaration::METHOD:
        if (parentKind != Declaration::INTERFACE) {
          errorReporter.addErrorOn(decl, "Methods can only appear in interfaces.");
        }
        break;
      case Declaration::FIELD:
      case Declaration::UNION:
      case Declaration::GROUP:
        switch (parentKind) {
          case Declaration::STRUCT:
          case Declaration::UNION:
          case Declaration::GROUP:
            // OK.
            break;
          default:
            errorReporter.addErrorOn(decl, "This declaration can only appear in structs.");
            break;
        }

        // Struct members may have nested decls.  We need to check those here, because no one else
        // is going to do it.
        if (decl.getName().getValue().size() == 0) {
          // Unnamed union.  Check members as if they are in the same scope.
          check(decl.getNestedDecls(), decl.which());
        } else {
          // Children are in their own scope.
          DuplicateNameDetector(errorReporter)
              .check(decl.getNestedDecls(), decl.which());
        }

        break;

      default:
        errorReporter.addErrorOn(decl, "This kind of declaration doesn't belong here.");
        break;
    }
  }
}